

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O3

bool embree::operator<(Ref<embree::XML> *a,Ref<embree::XML> *b)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  byte extraout_var;
  pointer pRVar3;
  pointer pTVar4;
  Ref<embree::XML> *b_00;
  Token *b_01;
  pointer pRVar5;
  XML *pXVar6;
  pointer pTVar7;
  pointer a_00;
  pointer a_01;
  XML *pXVar8;
  
  pXVar6 = a->ptr;
  pXVar8 = b->ptr;
  __n = (pXVar6->name)._M_string_length;
  if ((__n != (pXVar8->name)._M_string_length) ||
     ((__n != 0 &&
      (iVar2 = bcmp((pXVar6->name)._M_dataplus._M_p,(pXVar8->name)._M_dataplus._M_p,__n), iVar2 != 0
      )))) {
    std::__cxx11::string::compare((string *)&pXVar6->name);
    return (bool)(extraout_var >> 7);
  }
  if ((pXVar6->parms)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      (pXVar8->parms)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar1 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      ((pXVar6->parms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )&(pXVar6->parms)._M_t._M_impl.super__Rb_tree_header,
                       (pXVar8->parms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
    pXVar6 = a->ptr;
    pXVar8 = b->ptr;
    if (bVar1) {
      a_00 = (pXVar6->children).
             super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      pRVar5 = (pXVar6->children).
               super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      b_00 = (pXVar8->children).
             super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      pRVar3 = (pXVar8->children).
               super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((long)pRVar5 - (long)a_00 != (long)pRVar3 - (long)b_00) {
LAB_0015d322:
        bVar1 = std::
                __lexicographical_compare_impl<embree::Ref<embree::XML>const*,embree::Ref<embree::XML>const*,__gnu_cxx::__ops::_Iter_less_iter>
                          (a_00,pRVar5,b_00,pRVar3);
        return bVar1;
      }
      if (a_00 != pRVar5) {
        do {
          bVar1 = operator==(a_00,b_00);
          if (!bVar1) break;
          a_00 = a_00 + 1;
          b_00 = b_00 + 1;
        } while (a_00 != pRVar5);
        pXVar6 = a->ptr;
        pXVar8 = b->ptr;
        if (!bVar1) {
          a_00 = (pXVar6->children).
                 super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          pRVar5 = (pXVar6->children).
                   super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          b_00 = (pXVar8->children).
                 super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          pRVar3 = (pXVar8->children).
                   super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          goto LAB_0015d322;
        }
      }
      a_01 = (pXVar6->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
             _M_impl.super__Vector_impl_data._M_start;
      pTVar7 = (pXVar6->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      b_01 = (pXVar8->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
             _M_impl.super__Vector_impl_data._M_start;
      pTVar4 = (pXVar8->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if ((long)pTVar7 - (long)a_01 == (long)pTVar4 - (long)b_01) {
        if (a_01 != pTVar7) {
          do {
            bVar1 = operator==(a_01,b_01);
            if (!bVar1) break;
            a_01 = a_01 + 1;
            b_01 = b_01 + 1;
          } while (a_01 != pTVar7);
          if (!bVar1) {
            a_01 = (a->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                   _M_impl.super__Vector_impl_data._M_start;
            pTVar7 = (a->ptr->body).
                     super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            b_01 = (b->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                   _M_impl.super__Vector_impl_data._M_start;
            pTVar4 = (b->ptr->body).
                     super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            goto LAB_0015d35d;
          }
        }
        return false;
      }
LAB_0015d35d:
      bVar1 = std::
              __lexicographical_compare_impl<embree::Token_const*,embree::Token_const*,__gnu_cxx::__ops::_Iter_less_iter>
                        (a_01,pTVar7,b_01,pTVar4);
      return bVar1;
    }
  }
  bVar1 = std::
          __lexicographical_compare_impl<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_less_iter>
                    ((pXVar6->parms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                     &(pXVar6->parms)._M_t._M_impl.super__Rb_tree_header,
                     (pXVar8->parms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                     &(pXVar8->parms)._M_t._M_impl.super__Rb_tree_header);
  return bVar1;
}

Assistant:

bool operator <( const Ref<XML>& a, const Ref<XML>& b ) {
      if (a->name     != b->name    ) return a->name     < b->name;
      if (a->parms    != b->parms   ) return a->parms    < b->parms;
      if (a->children != b->children) return a->children < b->children;
      if (a->body     != b->body    ) return a->body     < b->body;
      return false;
    }